

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_src,size_t len,archive_string_conv *sc)

{
  archive_string *paVar1;
  size_t s;
  size_t w;
  char *pcStack_50;
  char t [4];
  char *e;
  uint32_t uc;
  wchar_t n;
  char *src;
  archive_string_conv *paStack_30;
  wchar_t ret;
  archive_string_conv *sc_local;
  size_t len_local;
  void *_src_local;
  archive_string *as_local;
  
  src._4_4_ = L'\0';
  _uc = (char *)_src;
  paStack_30 = sc;
  sc_local = (archive_string_conv *)len;
  len_local = (size_t)_src;
  _src_local = as;
  paVar1 = archive_string_ensure(as,as->length + len + 1);
  pcStack_50 = _uc;
  while( true ) {
    _uc = pcStack_50;
    if (paVar1 == (archive_string *)0x0) {
      return L'\xffffffff';
    }
    while (e._4_4_ = utf8_to_unicode((uint32_t *)&e,pcStack_50,(size_t)sc_local), L'\0' < e._4_4_) {
      pcStack_50 = pcStack_50 + e._4_4_;
      sc_local = (archive_string_conv *)((long)sc_local - (long)e._4_4_);
    }
    if (_uc < pcStack_50) {
      paVar1 = archive_string_append((archive_string *)_src_local,_uc,(long)pcStack_50 - (long)_uc);
      if (paVar1 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      _uc = pcStack_50;
    }
    if (e._4_4_ == L'\0') break;
    if (((e._4_4_ == L'\xfffffffd') && (0xd7ff < (uint)e)) && ((uint)e < 0xe000)) {
      e._4_4_ = cesu8_to_unicode((uint32_t *)&e,_uc,(size_t)sc_local);
    }
    if (e._4_4_ < L'\0') {
      src._4_4_ = L'\xffffffff';
      e._4_4_ = -e._4_4_;
    }
    _uc = _uc + e._4_4_;
    sc_local = (archive_string_conv *)((long)sc_local - (long)e._4_4_);
    s = unicode_to_utf8((char *)((long)&w + 4),4,(uint)e);
    paVar1 = archive_string_append((archive_string *)_src_local,(char *)((long)&w + 4),s);
    pcStack_50 = _uc;
  }
  return src._4_4_;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_src,
    size_t len, struct archive_string_conv *sc)
{
	int ret = 0;
	const char *src = _src;
	(void)sc; /* UNUSED */

	/* Pre-extend the destination */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	/* Invariant: src points to the first UTF8 byte that hasn't
	 * been copied to the destination `as`. */
	for (;;) {
		int n;
		uint32_t uc;
		const char *e = src;

		/* Skip UTF-8 sequences until we reach end-of-string or
		 * a code point that needs conversion. */
		while ((n = utf8_to_unicode(&uc, e, len)) > 0) {
			e += n;
			len -= n;
		}
		/* Copy the part that doesn't need conversion */
		if (e > src) {
			if (archive_string_append(as, src, e - src) == NULL)
				return (-1);
			src = e;
		}

		if (n == 0) {
			/* We reached end-of-string */
			return (ret);
		} else {
			/* Next code point needs conversion */
			char t[4];
			size_t w;

			/* Try decoding a surrogate pair */
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				n = cesu8_to_unicode(&uc, src, len);
			}
			/* Not a (valid) surrogate, so use a replacement char */
			if (n < 0) {
				ret = -1; /* Return -1 if we used any replacement */
				n *= -1;
			}
			/* Consume converted code point */
			src += n;
			len -= n;
			/* Convert and append new UTF-8 sequence. */
			w = unicode_to_utf8(t, sizeof(t), uc);
			if (archive_string_append(as, t, w) == NULL)
				return (-1);
		}
	}
}